

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall
Equality_importSourceNotEqual_Test::TestBody(Equality_importSourceNotEqual_Test *this)

{
  string *psVar1;
  byte bVar2;
  char cVar3;
  AssertionResult gtest_ar_;
  ImportSourcePtr is2;
  ImportSourcePtr is1;
  long *local_70;
  AssertionResult local_68;
  long local_58 [2];
  AssertHelper local_48 [8];
  byte local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  string *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  libcellml::ImportSource::create();
  libcellml::ImportSource::create();
  psVar1 = local_20;
  local_68._0_8_ = (string *)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"another_great_url","");
  libcellml::ImportSource::setUrl(psVar1);
  if ((string *)local_68._0_8_ != (string *)local_58) {
    operator_delete((void *)local_68._0_8_,local_58[0] + 1);
  }
  psVar1 = local_30;
  local_68._0_8_ = (string *)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"great_url","");
  libcellml::ImportSource::setUrl(psVar1);
  if ((string *)local_68._0_8_ != (string *)local_58) {
    operator_delete((void *)local_68._0_8_,local_58[0] + 1);
  }
  local_68._0_8_ = local_30;
  local_68.message_.ptr_ = local_28;
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_28->_M_string_length = (int)local_28->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_28->_M_string_length = (int)local_28->_M_string_length + 1;
    }
  }
  bVar2 = libcellml::Entity::equals((shared_ptr *)local_20);
  local_40[0] = bVar2 ^ 1;
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_68.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (bVar2 != 0) goto LAB_0011fc3a;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.message_.ptr_);
    if ((local_40[0] & 1) == 0) {
LAB_0011fc3a:
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_68,(char *)local_40,"is1->equals(is2)","true");
      testing::internal::AssertHelper::AssertHelper
                (local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
                 ,0x32b,(char *)local_68._0_8_);
      testing::internal::AssertHelper::operator=(local_48,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(local_48);
      if ((string *)local_68._0_8_ != (string *)local_58) {
        operator_delete((void *)local_68._0_8_,local_58[0] + 1);
      }
      if (((local_70 != (long *)0x0) && (cVar3 = testing::internal::IsTrue(true), cVar3 != '\0')) &&
         (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68._0_8_ = local_20;
  local_68.message_.ptr_ = local_18;
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_18->_M_string_length = (int)local_18->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_18->_M_string_length = (int)local_18->_M_string_length + 1;
    }
  }
  bVar2 = libcellml::Entity::equals((shared_ptr *)local_30);
  local_40[0] = bVar2 ^ 1;
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_68.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (bVar2 == 0) goto LAB_0011fe00;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.message_.ptr_);
    if ((local_40[0] & 1) != 0) goto LAB_0011fe00;
  }
  testing::Message::Message((Message *)&local_70);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_68,(char *)local_40,"is2->equals(is1)","true");
  testing::internal::AssertHelper::AssertHelper
            (local_48,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
             ,0x32c,(char *)local_68._0_8_);
  testing::internal::AssertHelper::operator=(local_48,(Message *)&local_70);
  testing::internal::AssertHelper::~AssertHelper(local_48);
  if ((string *)local_68._0_8_ != (string *)local_58) {
    operator_delete((void *)local_68._0_8_,local_58[0] + 1);
  }
  if (((local_70 != (long *)0x0) && (cVar3 = testing::internal::IsTrue(true), cVar3 != '\0')) &&
     (local_70 != (long *)0x0)) {
    (**(code **)(*local_70 + 8))();
  }
LAB_0011fe00:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
  }
  return;
}

Assistant:

TEST(Equality, importSourceNotEqual)
{
    libcellml::ImportSourcePtr is1 = libcellml::ImportSource::create();
    libcellml::ImportSourcePtr is2 = libcellml::ImportSource::create();

    is1->setUrl("another_great_url");
    is2->setUrl("great_url");

    EXPECT_FALSE(is1->equals(is2));
    EXPECT_FALSE(is2->equals(is1));
}